

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void duckdb_je_arena_stats_merge
               (tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms,
               ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy,
               arena_stats_t *astats,bin_stats_data_t *bstats,arena_stats_large_t *lstats,
               pac_estats_t *estats,hpa_shard_stats_t *hpastats,sec_stats_t *secstats)

{
  uint64_t *puVar1;
  bin_stats_data_t *pbVar2;
  malloc_mutex_t *mutex;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  cache_bin_array_descriptor_t *pcVar9;
  cache_bin_array_descriptor_t *pcVar10;
  base_t *pbVar11;
  void *pvVar12;
  witness_t *pwVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint32_t uVar17;
  atomic_u32_t aVar18;
  int iVar19;
  size_t *psVar20;
  arena_t *paVar21;
  long lVar22;
  ulong uVar23;
  uint j;
  ulong uVar24;
  nstime_t *a;
  arena_t *paVar25;
  cache_bin_array_descriptor_t *pcVar26;
  long lVar27;
  cache_bin_info_t *pcVar28;
  mutex_prof_data_t *source;
  arena_t *paVar29;
  nstime_t *pnVar30;
  size_t metadata_thp;
  size_t base_rtree_allocated;
  size_t base_edata_allocated;
  size_t base_mapped;
  size_t base_resident;
  size_t base_allocated;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  duckdb_je_arena_basic_stats_merge
            (tsdn,arena,nthreads,dss,dirty_decay_ms,muzzy_decay_ms,nactive,ndirty,nmuzzy);
  duckdb_je_base_stats_get
            (tsdn,arena->base,&local_38,&local_50,&local_58,&local_40,&local_48,&local_60);
  astats->mapped = astats->mapped + (((arena->pa_shard).pac.stats)->pac_mapped).repr + local_48;
  astats->resident = astats->resident + local_40;
  astats->base = astats->base + local_38;
  astats->metadata_edata = astats->metadata_edata + local_50;
  astats->metadata_rtree = astats->metadata_rtree + local_58;
  (astats->internal).repr = (astats->internal).repr + (arena->stats).internal.repr;
  astats->metadata_thp = astats->metadata_thp + local_60;
  psVar20 = duckdb_je_sz_index2size_tab + 0x24;
  for (lVar22 = 0; lVar22 != 0x498; lVar22 = lVar22 + 6) {
    uVar6 = (&(arena->stats).lstats[0].ndalloc)[lVar22].val.repr;
    (&lstats->ndalloc)[lVar22].val.repr = (&lstats->ndalloc)[lVar22].val.repr + uVar6;
    astats->ndalloc_large = astats->ndalloc_large + uVar6;
    uVar7 = (&(arena->stats).lstats[0].nmalloc)[lVar22].val.repr;
    (&lstats->nmalloc)[lVar22].val.repr = (&lstats->nmalloc)[lVar22].val.repr + uVar7;
    astats->nmalloc_large = astats->nmalloc_large + uVar7;
    lVar27 = (&(arena->stats).lstats[0].nrequests)[lVar22].val.repr + uVar7;
    (&lstats->nrequests)[lVar22].val.repr = (&lstats->nrequests)[lVar22].val.repr + lVar27;
    astats->nrequests_large = astats->nrequests_large + lVar27;
    (&lstats->nfills)[lVar22].val.repr = (&lstats->nfills)[lVar22].val.repr + uVar7;
    astats->nfills_large = astats->nfills_large + uVar7;
    uVar8 = (&(arena->stats).lstats[0].nflushes)[lVar22].val.repr;
    (&lstats->nflushes)[lVar22].val.repr = (&lstats->nflushes)[lVar22].val.repr + uVar8;
    astats->nflushes_large = astats->nflushes_large + uVar8;
    (&lstats->curlextents)[lVar22] = (&lstats->curlextents)[lVar22] + (uVar7 - uVar6);
    astats->allocated_large = astats->allocated_large + (uVar7 - uVar6) * *psVar20;
    psVar20 = psVar20 + 1;
  }
  duckdb_je_pa_shard_stats_merge
            (tsdn,&arena->pa_shard,&astats->pa_shard_stats,estats,hpastats,secstats,
             &astats->resident);
  astats->tcache_bytes = 0;
  astats->tcache_stashed_bytes = 0;
  malloc_mutex_lock(tsdn,&arena->tcache_ql_mtx);
  pcVar9 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  pcVar26 = pcVar9;
  while (pcVar26 != (cache_bin_array_descriptor_t *)0x0) {
    pcVar28 = &pcVar26->bins->bin_info;
    for (lVar22 = 0; lVar22 != 0x49; lVar22 = lVar22 + 1) {
      if (((cache_bin_t *)(pcVar28 + -0xb))->stack_head != (void **)&duckdb_je_disabled_bin) {
        iVar19 = *(int *)(pcVar28 + -1);
        uVar3 = pcVar28->ncached_max;
        uVar4 = pcVar28[-2].ncached_max;
        astats->tcache_bytes =
             astats->tcache_bytes +
             (ulong)((iVar19 - (int)((cache_bin_t *)(pcVar28 + -0xb))->stack_head & 0xffffU) >> 3) *
             duckdb_je_sz_index2size_tab[lVar22];
        astats->tcache_stashed_bytes =
             astats->tcache_stashed_bytes +
             (ulong)((uint)uVar4 - (iVar19 + (uint)uVar3 * -8 & 0xffff) >> 3 & 0xffff) *
             duckdb_je_sz_index2size_tab[lVar22];
      }
      pcVar28 = pcVar28 + 0xc;
    }
    pcVar10 = (pcVar26->link).qre_next;
    pcVar26 = (cache_bin_array_descriptor_t *)0x0;
    if (pcVar10 != pcVar9) {
      pcVar26 = pcVar10;
    }
  }
  uVar6 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar17 = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x20);
  aVar18.repr = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x24);
  uVar15 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[8].prev_owner =
       (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[8].n_lock_ops = uVar16;
  astats->mutex_prof_data[8].max_n_thds = uVar17;
  astats->mutex_prof_data[8].n_waiting_thds = (atomic_u32_t)aVar18.repr;
  astats->mutex_prof_data[8].n_owner_switches = uVar15;
  astats->mutex_prof_data[8].n_wait_times = uVar8;
  astats->mutex_prof_data[8].n_spin_acquired = uVar14;
  astats->mutex_prof_data[8].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[8].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[8].n_waiting_thds.repr = 0;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48));
  malloc_mutex_lock(tsdn,&arena->large_mtx);
  uVar6 = (arena->large_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->large_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->large_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->large_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar17 = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x20);
  aVar18.repr = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x24);
  uVar15 = (arena->large_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[0].prev_owner = (arena->large_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[0].n_lock_ops = uVar16;
  astats->mutex_prof_data[0].max_n_thds = uVar17;
  astats->mutex_prof_data[0].n_waiting_thds = (atomic_u32_t)aVar18.repr;
  astats->mutex_prof_data[0].n_owner_switches = uVar15;
  astats->mutex_prof_data[0].n_wait_times = uVar8;
  astats->mutex_prof_data[0].n_spin_acquired = uVar14;
  astats->mutex_prof_data[0].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[0].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[0].n_waiting_thds.repr = 0;
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48));
  malloc_mutex_lock(tsdn,&arena->base->mtx);
  pbVar11 = arena->base;
  uVar6 = (pbVar11->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (pbVar11->mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (pbVar11->mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (pbVar11->mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar17 = *(uint32_t *)((long)&(pbVar11->mtx).field_0 + 0x20);
  aVar18.repr = *(uint32_t *)((long)&(pbVar11->mtx).field_0 + 0x24);
  uVar15 = (pbVar11->mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (pbVar11->mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[7].prev_owner = (pbVar11->mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[7].n_lock_ops = uVar16;
  astats->mutex_prof_data[7].max_n_thds = uVar17;
  astats->mutex_prof_data[7].n_waiting_thds = (atomic_u32_t)aVar18.repr;
  astats->mutex_prof_data[7].n_owner_switches = uVar15;
  astats->mutex_prof_data[7].n_wait_times = uVar8;
  astats->mutex_prof_data[7].n_spin_acquired = uVar14;
  astats->mutex_prof_data[7].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[7].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[7].n_waiting_thds.repr = 0;
  pbVar11 = arena->base;
  (pbVar11->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x48));
  duckdb_je_pa_shard_mtx_stats_read(tsdn,&arena->pa_shard,astats->mutex_prof_data);
  pnVar30 = &astats->uptime;
  duckdb_je_nstime_copy(pnVar30,&arena->create_time);
  nstime_update_impl(pnVar30);
  duckdb_je_nstime_subtract(pnVar30,&arena->create_time);
  for (uVar23 = 0; uVar23 != 0x24; uVar23 = uVar23 + 1) {
    pbVar2 = bstats + uVar23;
    pnVar30 = &bstats[uVar23].mutex_data.max_wait_time;
    paVar21 = arena;
    paVar25 = arena;
    for (uVar24 = 0; uVar24 < duckdb_je_bin_infos[uVar23].n_shards; uVar24 = uVar24 + 1) {
      uVar5 = duckdb_je_arena_bin_offsets[uVar23];
      paVar29 = paVar21;
      if (uVar23 < duckdb_je_bin_info_nbatched_sizes) {
        paVar29 = paVar25;
      }
      mutex = (malloc_mutex_t *)((long)&paVar29->nthreads[0].repr + (ulong)uVar5);
      malloc_mutex_lock(tsdn,mutex);
      duckdb_je_nstime_add(&bstats[uVar23].mutex_data.tot_wait_time,(nstime_t *)mutex);
      a = (nstime_t *)((long)&paVar29->nthreads[2].repr + (ulong)uVar5);
      iVar19 = duckdb_je_nstime_compare(a,pnVar30);
      if (0 < iVar19) {
        duckdb_je_nstime_copy(pnVar30,a);
      }
      pvVar12 = (mutex->field_0).witness.opaque;
      (pbVar2->mutex_data).n_wait_times =
           (uint64_t)((mutex->field_0).witness.comp + (pbVar2->mutex_data).n_wait_times);
      (pbVar2->mutex_data).n_spin_acquired = (pbVar2->mutex_data).n_spin_acquired + (long)pvVar12;
      uVar5 = *(uint *)((long)&mutex->field_0 + 0x20);
      if ((pbVar2->mutex_data).max_n_thds < uVar5) {
        (pbVar2->mutex_data).max_n_thds = uVar5;
      }
      (pbVar2->mutex_data).n_waiting_thds.repr = 0;
      puVar1 = &(pbVar2->mutex_data).n_owner_switches;
      *puVar1 = (long)&((mutex->field_0).witness.link.qre_prev)->name + *puVar1;
      puVar1 = &(pbVar2->mutex_data).n_lock_ops;
      *puVar1 = *puVar1 + (mutex->field_0).field_0.prof_data.n_lock_ops;
      uVar6 = mutex[1].field_0.field_0.prof_data.max_wait_time.ns;
      (pbVar2->stats_data).nmalloc =
           (uint64_t)(mutex[1].field_0.witness.name + (pbVar2->stats_data).nmalloc);
      (pbVar2->stats_data).ndalloc = (pbVar2->stats_data).ndalloc + uVar6;
      pvVar12 = mutex[1].field_0.witness.opaque;
      (pbVar2->stats_data).nrequests =
           (uint64_t)(mutex[1].field_0.witness.comp + (pbVar2->stats_data).nrequests);
      (pbVar2->stats_data).curregs = (long)pvVar12 + (pbVar2->stats_data).curregs;
      pwVar13 = mutex[1].field_0.witness.link.qre_prev;
      (pbVar2->stats_data).nfills =
           (long)&(mutex[1].field_0.witness.link.qre_next)->name + (pbVar2->stats_data).nfills;
      (pbVar2->stats_data).nflushes = (long)&pwVar13->name + (pbVar2->stats_data).nflushes;
      uVar6 = mutex[1].field_0.field_0.prof_data.n_lock_ops;
      (pbVar2->stats_data).nslabs =
           (uint64_t)
           (&((mutex[1].field_0.field_0.prof_data.prev_owner)->tsd).
             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
           (pbVar2->stats_data).nslabs);
      (pbVar2->stats_data).reslabs = (pbVar2->stats_data).reslabs + uVar6;
      lVar22 = *(long *)((long)&mutex[1].field_0 + 0x48);
      (pbVar2->stats_data).curslabs =
           (pbVar2->stats_data).curslabs + *(long *)((long)&mutex[1].field_0 + 0x40);
      (pbVar2->stats_data).nonfull_slabs = (pbVar2->stats_data).nonfull_slabs + lVar22;
      lVar22 = *(long *)((long)&mutex[1].field_0 + 0x60);
      (pbVar2->stats_data).batch_failed_pushes =
           (pbVar2->stats_data).batch_failed_pushes + *(long *)((long)&mutex[1].field_0 + 0x58);
      (pbVar2->stats_data).batch_pushes = (pbVar2->stats_data).batch_pushes + lVar22;
      puVar1 = &(pbVar2->stats_data).batch_pushed_elems;
      *puVar1 = *puVar1 + *(long *)((long)&mutex[1].field_0 + 0x68);
      (mutex->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&mutex->field_0 + 0x48));
      paVar25 = (arena_t *)&(paVar25->stats).mutex_prof_data[6].n_owner_switches;
      paVar21 = (arena_t *)&(paVar21->stats).mutex_prof_data[0].max_n_thds;
    }
  }
  return;
}

Assistant:

void
arena_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy, arena_stats_t *astats,
    bin_stats_data_t *bstats, arena_stats_large_t *lstats,
    pac_estats_t *estats, hpa_shard_stats_t *hpastats, sec_stats_t *secstats) {
	cassert(config_stats);

	arena_basic_stats_merge(tsdn, arena, nthreads, dss, dirty_decay_ms,
	    muzzy_decay_ms, nactive, ndirty, nmuzzy);

	size_t base_allocated, base_edata_allocated, base_rtree_allocated,
	    base_resident, base_mapped, metadata_thp;
	base_stats_get(tsdn, arena->base, &base_allocated,
	    &base_edata_allocated, &base_rtree_allocated, &base_resident,
	    &base_mapped, &metadata_thp);
	size_t pac_mapped_sz = pac_mapped(&arena->pa_shard.pac);
	astats->mapped += base_mapped + pac_mapped_sz;
	astats->resident += base_resident;

	LOCKEDINT_MTX_LOCK(tsdn, arena->stats.mtx);

	astats->base += base_allocated;
	astats->metadata_edata += base_edata_allocated;
	astats->metadata_rtree += base_rtree_allocated;
	atomic_load_add_store_zu(&astats->internal, arena_internal_get(arena));
	astats->metadata_thp += metadata_thp;

	for (szind_t i = 0; i < SC_NSIZES - SC_NBINS; i++) {
		/* ndalloc should be read before nmalloc,
		 * since otherwise it is possible for ndalloc to be incremented,
		 * and the following can become true: ndalloc > nmalloc */
		uint64_t ndalloc = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].ndalloc);
		locked_inc_u64_unsynchronized(&lstats[i].ndalloc, ndalloc);
		astats->ndalloc_large += ndalloc;

		uint64_t nmalloc = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].nmalloc);
		locked_inc_u64_unsynchronized(&lstats[i].nmalloc, nmalloc);
		astats->nmalloc_large += nmalloc;

		uint64_t nrequests = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].nrequests);
		locked_inc_u64_unsynchronized(&lstats[i].nrequests,
		    nmalloc + nrequests);
		astats->nrequests_large += nmalloc + nrequests;

		/* nfill == nmalloc for large currently. */
		locked_inc_u64_unsynchronized(&lstats[i].nfills, nmalloc);
		astats->nfills_large += nmalloc;

		uint64_t nflush = locked_read_u64(tsdn,
		    LOCKEDINT_MTX(arena->stats.mtx),
		    &arena->stats.lstats[i].nflushes);
		locked_inc_u64_unsynchronized(&lstats[i].nflushes, nflush);
		astats->nflushes_large += nflush;

		assert(nmalloc >= ndalloc);
		assert(nmalloc - ndalloc <= SIZE_T_MAX);
		size_t curlextents = (size_t)(nmalloc - ndalloc);
		lstats[i].curlextents += curlextents;
		astats->allocated_large +=
		    curlextents * sz_index2size(SC_NBINS + i);
	}

	pa_shard_stats_merge(tsdn, &arena->pa_shard, &astats->pa_shard_stats,
	    estats, hpastats, secstats, &astats->resident);

	LOCKEDINT_MTX_UNLOCK(tsdn, arena->stats.mtx);

	/* Currently cached bytes and sanitizer-stashed bytes in tcache. */
	astats->tcache_bytes = 0;
	astats->tcache_stashed_bytes = 0;
	malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
	cache_bin_array_descriptor_t *descriptor;
	ql_foreach(descriptor, &arena->cache_bin_array_descriptor_ql, link) {
		for (szind_t i = 0; i < TCACHE_NBINS_MAX; i++) {
			cache_bin_t *cache_bin = &descriptor->bins[i];
			if (cache_bin_disabled(cache_bin)) {
				continue;
			}

			cache_bin_sz_t ncached, nstashed;
			cache_bin_nitems_get_remote(cache_bin, &ncached, &nstashed);
			astats->tcache_bytes += ncached * sz_index2size(i);
			astats->tcache_stashed_bytes += nstashed *
			    sz_index2size(i);
		}
	}
	malloc_mutex_prof_read(tsdn,
	    &astats->mutex_prof_data[arena_prof_mutex_tcache_list],
	    &arena->tcache_ql_mtx);
	malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);

#define READ_ARENA_MUTEX_PROF_DATA(mtx, ind)				\
    malloc_mutex_lock(tsdn, &arena->mtx);				\
    malloc_mutex_prof_read(tsdn, &astats->mutex_prof_data[ind],		\
        &arena->mtx);							\
    malloc_mutex_unlock(tsdn, &arena->mtx);

	/* Gather per arena mutex profiling data. */
	READ_ARENA_MUTEX_PROF_DATA(large_mtx, arena_prof_mutex_large);
	READ_ARENA_MUTEX_PROF_DATA(base->mtx,
	    arena_prof_mutex_base);
#undef READ_ARENA_MUTEX_PROF_DATA
	pa_shard_mtx_stats_read(tsdn, &arena->pa_shard,
	    astats->mutex_prof_data);

	nstime_copy(&astats->uptime, &arena->create_time);
	nstime_update(&astats->uptime);
	nstime_subtract(&astats->uptime, &arena->create_time);

	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_stats_merge(tsdn, &bstats[i],
			    arena_get_bin(arena, i, j));
		}
	}
}